

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O3

bool __thiscall
cmFindProgramCommand::InitialPass
          (cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *psVar1;
  string *name;
  cmMakefile *this_00;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string result;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  psVar1 = &(this->super_cmFindBase).VariableDocumentation;
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(this->super_cmFindBase).VariableDocumentation._M_string_length
             ,0x4ca4c2);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,0,
             (char *)(this->super_cmFindBase).super_cmFindCommon.CMakePathName._M_string_length,
             0x4c1dc6);
  iVar3 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.super_cmObject.
            _vptr_cmObject[0xc])(this,argsIn);
  if (SUB41(iVar3,0) != false) {
    if ((this->super_cmFindBase).AlreadyInCache == true) {
      if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo == true) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
                   &(this->super_cmFindBase).VariableName,"",
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
      }
    }
    else {
      FindProgram_abi_cxx11_(&local_50,this);
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      name = &(this->super_cmFindBase).VariableName;
      this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      if (iVar4 == 0) {
        pcVar2 = (this->super_cmFindBase).VariableName._M_dataplus._M_p;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar2,
                   pcVar2 + (this->super_cmFindBase).VariableName._M_string_length);
        std::__cxx11::string::append((char *)local_70);
        cmMakefile::AddCacheDefinition
                  (this_00,name,(char *)local_70[0],(psVar1->_M_dataplus)._M_p,FILEPATH,false);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
      else {
        cmMakefile::AddCacheDefinition
                  (this_00,name,local_50._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,FILEPATH,false)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return SUB41(iVar3,0);
}

Assistant:

bool cmFindProgramCommand
::InitialPass(std::vector<std::string> const& argsIn, cmExecutionStatus &)
{
  this->VariableDocumentation = "Path to a program.";
  this->CMakePathName = "PROGRAM";
  // call cmFindBase::ParseArguments
  if(!this->ParseArguments(argsIn))
    {
    return false;
    }
  if(this->AlreadyInCache)
    {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if(this->AlreadyInCacheWithoutMetaInfo)
      {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmState::FILEPATH);
      }
    return true;
    }

  std::string result = FindProgram();
  if(result != "")
    {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName,
                                       result.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmState::FILEPATH);

    return true;
    }
  this->Makefile->AddCacheDefinition(this->VariableName,
                                 (this->VariableName + "-NOTFOUND").c_str(),
                                 this->VariableDocumentation.c_str(),
                                 cmState::FILEPATH);
  return true;
}